

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

pointer __thiscall QList<QPersistentModelIndex>::data(QList<QPersistentModelIndex> *this)

{
  QArrayDataPointer<QPersistentModelIndex> *this_00;
  QPersistentModelIndex *pQVar1;
  QArrayDataPointer<QPersistentModelIndex> *in_RDI;
  
  detach((QList<QPersistentModelIndex> *)0x8f482c);
  this_00 = (QArrayDataPointer<QPersistentModelIndex> *)
            QArrayDataPointer<QPersistentModelIndex>::operator->(in_RDI);
  pQVar1 = QArrayDataPointer<QPersistentModelIndex>::data(this_00);
  return pQVar1;
}

Assistant:

pointer data() { detach(); return d->data(); }